

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O0

uint64_t HashFile(string *filename,bool one_block)

{
  char cVar1;
  long lVar2;
  byte bVar3;
  _Ios_Openmode _Var4;
  streamoff sVar5;
  ostream *poVar6;
  long *plVar7;
  char *pcVar8;
  reference pvVar9;
  byte in_SIL;
  string *in_RDI;
  char x_1;
  uint64_t x;
  int i;
  vector<char,_std::allocator<char>_> buffer;
  long size;
  long next_pos;
  long pos;
  uint64_t magic;
  long end;
  ifstream f;
  allocator_type *in_stack_fffffffffffffc20;
  size_type in_stack_fffffffffffffc28;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffc30;
  string *in_stack_fffffffffffffc88;
  undefined8 in_stack_fffffffffffffc90;
  int line;
  string *in_stack_fffffffffffffc98;
  allocator *paVar10;
  int local_308;
  allocator<char> local_301;
  vector<char,_std::allocator<char>_> local_300;
  long local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  uint64_t local_2c8;
  fpos local_2c0 [23];
  allocator local_2a9;
  string local_2a8 [39];
  allocator local_281;
  string local_280 [36];
  Logger local_25c;
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  streamoff local_238;
  int local_230;
  char local_220 [527];
  byte local_11;
  uint64_t local_8;
  
  line = (int)((ulong)in_stack_fffffffffffffc90 >> 0x20);
  local_11 = in_SIL & 1;
  _Var4 = std::operator|(_S_ate,_S_bin);
  std::ifstream::ifstream(local_220,in_RDI,_Var4);
  bVar3 = std::ios::bad();
  if ((bVar3 & 1) == 0) {
    local_248 = std::istream::tellg();
    local_238 = std::fpos::operator_cast_to_long((fpos *)local_248);
    std::istream::seekg((long)local_220,_S_beg);
    local_258 = std::istream::tellg();
    sVar5 = std::fpos::operator_cast_to_long((fpos *)local_258);
    if ((int)sVar5 != 0) {
      Logger::Logger(&local_25c,ERR);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_280,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                 ,&local_281);
      paVar10 = &local_2a9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2a8,"HashFile",paVar10);
      poVar6 = Logger::Start((LogSeverity)((ulong)paVar10 >> 0x20),in_stack_fffffffffffffc98,line,
                             in_stack_fffffffffffffc88);
      poVar6 = std::operator<<(poVar6,"CHECK_EQ failed ");
      poVar6 = std::operator<<(poVar6,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/base/file_util.h"
                              );
      poVar6 = std::operator<<(poVar6,":");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x14d);
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"static_cast<int>(f.tellg())");
      poVar6 = std::operator<<(poVar6," = ");
      local_2c0._0_16_ = std::istream::tellg();
      sVar5 = std::fpos::operator_cast_to_long(local_2c0);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,(int)sVar5);
      poVar6 = std::operator<<(poVar6,"\n");
      poVar6 = std::operator<<(poVar6,"0");
      poVar6 = std::operator<<(poVar6," = ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,0);
      std::operator<<(poVar6,"\n");
      std::__cxx11::string::~string(local_2a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
      std::__cxx11::string::~string(local_280);
      std::allocator<char>::~allocator((allocator<char> *)&local_281);
      Logger::~Logger((Logger *)poVar6);
      abort();
    }
    local_2c8 = 0x160f7;
    local_2d0 = 0;
    do {
      if (local_238 <= local_2d0) break;
      local_2e0 = local_2d0 + 0xfa000;
      plVar7 = std::min<long>(&local_2e0,&local_238);
      local_2d8 = *plVar7;
      local_2e8 = local_2d8 - local_2d0;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,in_stack_fffffffffffffc20);
      std::allocator<char>::~allocator(&local_301);
      pcVar8 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x1c12ee);
      std::istream::read(local_220,(long)pcVar8);
      for (local_308 = 0; (long)local_308 < local_2e8 + -8; local_308 = local_308 + 8) {
        pcVar8 = std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)0x1c133d);
        lVar2 = *(long *)(pcVar8 + local_308);
        local_2c8 = ((local_2c8 + lVar2) * (local_2c8 + lVar2 + 1) >> 1) + lVar2;
      }
      for (; local_308 < local_2e8; local_308 = local_308 + 1) {
        pvVar9 = std::vector<char,_std::allocator<char>_>::operator[](&local_300,(long)local_308);
        cVar1 = *pvVar9;
        local_2c8 = ((local_2c8 + (long)cVar1) * (local_2c8 + (long)cVar1 + 1) >> 1) + (long)cVar1;
      }
      local_2d0 = local_2d8;
      if ((local_11 & 1) == 0) {
        local_230 = 0;
      }
      else {
        local_230 = 2;
      }
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffc20);
    } while (local_230 == 0);
    local_8 = local_2c8;
  }
  else {
    local_8 = 0;
  }
  local_230 = 1;
  std::ifstream::~ifstream(local_220);
  return local_8;
}

Assistant:

inline uint64_t HashFile(const std::string &filename, bool one_block=false) {
  std::ifstream f(filename, std::ios::ate | std::ios::binary);
  if (f.bad()) { return 0; }

  long end = (long) f.tellg();
  f.seekg(0, std::ios::beg);
  CHECK_EQ(static_cast<int>(f.tellg()), 0);

  uint64_t magic = 90359;
  for (long pos = 0; pos < end; ) {
#ifndef _MSC_VER
    long next_pos = std::min(pos + kChunkSize, end);
#else
    long next_pos = __min(pos + kChunkSize, end);
#endif
    long size = next_pos - pos;
    std::vector<char> buffer(kChunkSize);
    f.read(buffer.data(), size);

    int i = 0;
    while (i < size - 8) {
      uint64_t x = *reinterpret_cast<uint64_t *>(buffer.data() + i);
      magic = ((magic + x) * (magic + x + 1) >> 1) + x;
      i += 8;
    }
    for ( ; i < size; i++) {
      char x = buffer[i];
      magic = ((magic + x) * (magic + x + 1) >> 1) + x;
    }

    pos = next_pos;
    if (one_block) { break; }
  }

  return magic;
}